

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   out)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  const_reference pvVar8;
  char *pcVar9;
  range_check_result rVar10;
  char cVar11;
  unsigned_long line;
  size_type index;
  long lVar12;
  ulong uVar13;
  sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool cond;
  regex_error local_70;
  
  pbVar3 = (byte *)cur->_M_current;
  cVar11 = (char)out.container;
  if (pbVar3 == (byte *)end._M_current) goto LAB_0013e71d;
  pbVar1 = pbVar3 + 1;
  cur->_M_current = (char *)pbVar1;
  bVar2 = *pbVar3;
  if (bVar2 < 0x61) {
    if (((bVar2 == 0x45) || (bVar2 == 0x4c)) || (bVar2 == 0x55)) goto LAB_0013e71d;
switchD_0013e709_caseD_62:
    iVar7 = (**(code **)(**(long **)(this + 0x80) + 0x28))
                      (*(long **)(this + 0x80),(int)(char)bVar2,10);
    if (0 < iVar7) {
      iVar7 = (**(code **)(**(long **)(this + 0x80) + 0x28))
                        (*(long **)(this + 0x80),(int)(char)bVar2,10);
      this_00 = (sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(this + 8);
      index = (size_type)iVar7;
      pvVar8 = detail::
               sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,index);
      if (pvVar8->matched != true) {
        return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )out.container;
      }
      pvVar8 = detail::
               sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,index);
      pcVar9 = (pvVar8->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
      pvVar8 = detail::
               sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,index);
      lVar12 = (long)(pvVar8->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current - (long)pcVar9;
      if (lVar12 < 1) {
        return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )out.container;
      }
      uVar13 = lVar12 + 1;
      do {
        std::__cxx11::string::push_back(cVar11);
        uVar13 = uVar13 - 1;
      } while (1 < uVar13);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )out.container;
    }
  }
  else {
    switch(bVar2) {
    case 0x61:
      break;
    default:
      goto switchD_0013e709_caseD_62;
    case 99:
      if (pbVar1 == (byte *)end._M_current) {
        std::runtime_error::runtime_error
                  (&local_70.super_runtime_error,"unexpected end of format found");
        local_70.super_exception.data_.px_ = (error_info_container *)0x0;
        local_70._0_8_ = &PTR__regex_error_00193398;
        local_70.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_001933c0;
        local_70.code_ = error_escape;
        local_70.super_exception.throw_function_ =
             "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = std::back_insert_iterator<std::basic_string<char>>]"
        ;
        local_70.super_exception.throw_file_ =
             "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/match_results.hpp"
        ;
        local_70.super_exception.throw_line_ = 0x4e2;
        local_70.super_exception.throw_column_ = -1;
        throw_exception<boost::xpressive::regex_error>(&local_70);
      }
      cVar5 = (**(code **)(**(long **)(this + 0x80) + 0x20))
                        (*(long **)(this + 0x80),0x61,0x7a,(int)(char)*pbVar1);
      if ((cVar5 == '\0') &&
         (cVar5 = (**(code **)(**(long **)(this + 0x80) + 0x20))
                            (*(long **)(this + 0x80),0x41,0x5a,(int)*cur->_M_current), cVar5 == '\0'
         )) {
        std::runtime_error::runtime_error
                  (&local_70.super_runtime_error,
                   "invalid escape control letter; must be one of a-z or A-Z");
        local_70.super_exception.data_.px_ = (error_info_container *)0x0;
        local_70._0_8_ = &PTR__regex_error_00193398;
        local_70.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_001933c0;
        local_70.code_ = error_escape;
        local_70.super_exception.throw_function_ =
             "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = std::back_insert_iterator<std::basic_string<char>>]"
        ;
        local_70.super_exception.throw_file_ =
             "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/match_results.hpp"
        ;
        local_70.super_exception.throw_line_ = 0x4e9;
        local_70.super_exception.throw_column_ = -1;
        throw_exception<boost::xpressive::regex_error>(&local_70);
      }
      detail::char_overflow_handler_::operator()
                ((char_overflow_handler_ *)&local_70,(uint)((byte)(*cur->_M_current % ' ') >> 7));
      std::__cxx11::string::push_back(cVar11);
      cur->_M_current = cur->_M_current + 1;
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )out.container;
    case 0x65:
      break;
    case 0x66:
      break;
    case 0x6c:
      break;
    case 0x6e:
      break;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x75:
      break;
    case 0x76:
      break;
    case 0x78:
      if (pbVar1 != (byte *)end._M_current) {
        if (*pbVar1 == 0x7b) {
          cur->_M_current = (char *)(pbVar3 + 2);
          detail::ensure_(pbVar3 + 2 != (byte *)end._M_current,error_escape,
                          "unexpected end of format found",
                          "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = std::back_insert_iterator<std::basic_string<char>>]"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                          ,0x4d2);
          pcVar9 = cur->_M_current;
          uVar6 = detail::
                  toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                            (cur,end,*(traits<char> **)(this + 0x80),0x10,0xffff);
          rVar10 = cNegOverflow;
          if (-1 < (int)uVar6) {
            rVar10 = (uint)(0xff < uVar6) * 2;
          }
          detail::char_overflow_handler_::operator()((char_overflow_handler_ *)&local_70,rVar10);
          std::__cxx11::string::push_back(cVar11);
          pcVar4 = cur->_M_current;
          cond = false;
          if ((pcVar4 != end._M_current) && (cond = false, (long)pcVar4 - (long)pcVar9 == 4)) {
            cur->_M_current = pcVar4 + 1;
            cond = *pcVar4 == '}';
          }
          pcVar9 = "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }";
          line = 0x4d6;
        }
        else {
          uVar6 = detail::
                  toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                            (cur,end,*(traits<char> **)(this + 0x80),0x10,0xff);
          rVar10 = cNegOverflow;
          if (-1 < (int)uVar6) {
            rVar10 = (uint)(0xff < uVar6) * 2;
          }
          detail::char_overflow_handler_::operator()((char_overflow_handler_ *)&local_70,rVar10);
          std::__cxx11::string::push_back(cVar11);
          cond = (long)cur->_M_current - (long)pbVar1 == 2;
          pcVar9 = "invalid hex escape : must be \\x HexDigit HexDigit";
          line = 0x4dd;
        }
        detail::ensure_(cond,error_escape,pcVar9,
                        "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = std::back_insert_iterator<std::basic_string<char>>]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                        ,line);
        return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )out.container;
      }
      std::runtime_error::runtime_error
                (&local_70.super_runtime_error,"unexpected end of format found");
      local_70.super_exception.data_.px_ = (error_info_container *)0x0;
      local_70._0_8_ = &PTR__regex_error_00193398;
      local_70.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_001933c0;
      local_70.code_ = error_escape;
      local_70.super_exception.throw_function_ =
           "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = std::back_insert_iterator<std::basic_string<char>>]"
      ;
      local_70.super_exception.throw_file_ =
           "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O3/KWStyle/Utilities/boost/xpressive/match_results.hpp"
      ;
      local_70.super_exception.throw_line_ = 0x4cf;
      local_70.super_exception.throw_column_ = -1;
      throw_exception<boost::xpressive::regex_error>(&local_70);
    }
  }
LAB_0013e71d:
  std::__cxx11::string::push_back(cVar11);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIterator format_escape_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        using namespace regex_constants;
        ForwardIterator tmp;
        // define an unsigned type the same size as char_type
        typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
        BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
        typedef numeric::conversion_traits<uchar_t, int> converstion_traits;
        numeric::converter<int, uchar_t, converstion_traits, detail::char_overflow_handler_> converter;

        if(cur == end)
        {
            *out++ = BOOST_XPR_CHAR_(char_type, '\\');
            return out;
        }

        char_type ch = *cur++;
        switch(ch)
        {
        case BOOST_XPR_CHAR_(char_type, 'a'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\a');
            break;

        case BOOST_XPR_CHAR_(char_type, 'e'):
            *out++ = converter(27);
            break;

        case BOOST_XPR_CHAR_(char_type, 'f'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\f');
            break;

        case BOOST_XPR_CHAR_(char_type, 'n'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\n');
            break;

        case BOOST_XPR_CHAR_(char_type, 'r'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\r');
            break;

        case BOOST_XPR_CHAR_(char_type, 't'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\t');
            break;

        case BOOST_XPR_CHAR_(char_type, 'v'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\v');
            break;

        case BOOST_XPR_CHAR_(char_type, 'x'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            if(BOOST_XPR_CHAR_(char_type, '{') == *cur)
            {
                BOOST_XPR_ENSURE_(++cur != end, error_escape, "unexpected end of format found");
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xffff));
                BOOST_XPR_ENSURE_(4 == std::distance(tmp, cur) && cur != end && BOOST_XPR_CHAR_(char_type, '}') == *cur++
                  , error_escape, "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }");
            }
            else
            {
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xff));
                BOOST_XPR_ENSURE_(2 == std::distance(tmp, cur), error_escape
                  , "invalid hex escape : must be \\x HexDigit HexDigit");
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'c'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            BOOST_XPR_ENSURE_
            (
                this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *cur)
             || this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *cur)
              , error_escape
              , "invalid escape control letter; must be one of a-z or A-Z"
            );
            // Convert to character according to ECMA-262, section 15.10.2.10:
            *out++ = converter(*cur % 32);
            ++cur;
            break;

        case BOOST_XPR_CHAR_(char_type, 'l'):
            if(!set_transform(out, detail::op_lower, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'l');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'L'):
            if(!set_transform(out, detail::op_lower, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'L');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'u'):
            if(!set_transform(out, detail::op_upper, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'u');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'U'):
            if(!set_transform(out, detail::op_upper, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'U');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'E'):
            if(!set_transform(out, detail::op_none, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'E');
            }
            break;

        default:
            // BUGBUG what about backreferences like \12 ?
            if(0 < this->traits_->value(ch, 10))
            {
                int sub = this->traits_->value(ch, 10);
                if(this->sub_matches_[ sub ].matched)
                    out = std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
            }
            else
            {
                *out++ = ch;
            }
            break;
        }

        return out;
    }